

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::EndPlot(void)

{
  ImVec2 IVar1;
  ImDrawList *pIVar2;
  ImDrawList *pIVar3;
  ImGuiIO *pIVar4;
  bool bVar5;
  ImU32 IVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  ImPlotAnnotation *p1;
  ImPlotItem *pIVar10;
  bool *pbVar11;
  ImVec2 *pIVar12;
  long lVar13;
  undefined8 in_R9;
  float fVar14;
  double dVar15;
  double rhs;
  ImPlotTime IVar16;
  ImVec4 IVar17;
  ImPlotDateTimeFmt IVar18;
  ImPlotDateTimeFmt fmt;
  ImPlotAxis *local_4a0;
  ImPlotAxis *local_490;
  bool local_441;
  ImVec2 *local_440;
  ImRect *local_428;
  float local_3ac;
  float local_39c;
  float local_384;
  float local_374;
  float local_36c;
  byte local_357;
  int local_354;
  int local_350;
  int i_7;
  int i_6;
  int i_5;
  double aspect;
  double ext_size_1;
  int i_4;
  double ext_size;
  undefined4 uStack_320;
  bool axis_equal;
  ImDrawListSharedData *local_31c;
  ImU32 local_314;
  ImU32 local_310;
  ImU32 col_bd;
  ImU32 col_bg;
  ImRect local_304;
  ImVec2 local_2f4;
  ImVec2 legend_pos;
  ImVec2 legend_size;
  int i_3;
  ImVec2 pos_1;
  ImVec2 size_1;
  undefined2 local_2b8;
  uint local_2a4;
  time_t local_290;
  int local_288;
  int local_280;
  ImPlotTimeUnit local_27c;
  int written;
  ImPlotTimeUnit unit;
  ImBufferWriter writer;
  char buffer [128];
  ImU32 col;
  ImVec2 v4;
  ImVec2 v3;
  ImVec2 v2;
  ImVec2 v1;
  ImVec2 h4;
  ImVec2 h3;
  ImVec2 h2;
  ImVec2 h1;
  ImVec2 xy;
  ImVec2 local_188;
  ImVec2 local_180;
  ImVec4 local_178;
  ImVec2 local_168;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  float local_148;
  int local_144;
  float len;
  int c;
  float min_len;
  int min_corner;
  ImVec2 corners [4];
  ImVec2 local_110;
  undefined1 local_108 [8];
  ImRect rect;
  ImVec2 local_e8;
  ImVec2 pos;
  ImVec2 local_d8;
  ImVec2 size;
  ImVec2 txt_size;
  ImPlotAnnotation *an;
  char *txt;
  int i_2;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 start;
  ImPlotTick *yt;
  int t_1;
  bool no_major;
  float direction;
  float x_start;
  int i_1;
  int axis_count;
  ImVec2 local_60;
  ImVec2 local_58;
  ImPlotTick *local_50;
  ImPlotTick *xt;
  int local_40;
  int t;
  int i;
  bool any_y_dragging;
  ImGuiIO *IO;
  ImDrawList *DrawList;
  ImGuiWindow *Window;
  ImPlotPlot *plot;
  ImGuiContext *G;
  ImPlotContext *gp;
  
  if (GImPlot == (ImPlotContext *)0x0) {
    __assert_fail("(GImPlot != __null) && \"No current context. Did you call ImPlot::CreateContext() or ImPlot::SetCurrentContext()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0x8b6,"void ImPlot::EndPlot()");
  }
  G = (ImGuiContext *)GImPlot;
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    plot = (ImPlotPlot *)GImGui;
    Window = (ImGuiWindow *)GImPlot->CurrentPlot;
    DrawList = (ImDrawList *)GImGui->CurrentWindow;
    IO = (ImGuiIO *)((ImGuiWindow *)DrawList)->DrawList;
    _i = ImGui::GetIO();
    local_357 = 1;
    if (((Window->HiddenFramesCanSkipItems & 1U) == 0) &&
       (local_357 = 1, ((uint)(Window->DC).LastItemRect.Min.y & 1) == 0)) {
      local_357 = (byte)(Window->DC).CurrentTableIdx;
    }
    t._3_1_ = local_357 & 1;
    PushPlotClipRect((float)(-(uint)(*(float *)((G->IO).KeysDown + 0x13c) == 0.0) & 0x3f800000));
    bVar5 = ImHasFlag<int,ImPlotAxisFlags_>((int)(Window->Pos).x,ImPlotAxisFlags_NoGridLines);
    if ((!bVar5) &&
       (bVar5 = ImHasFlag<int,ImPlotAxisFlags_>((int)(Window->Pos).x,ImPlotAxisFlags_Foreground),
       bVar5)) {
      RenderGridLinesX((ImDrawList *)IO,(ImPlotTickCollection *)((G->IO).KeyMap + 0xf),
                       (ImRect *)&(Window->DrawListInst).IdxBuffer,(ImU32)(Window->ScrollTarget).x,
                       (ImU32)(Window->ScrollTarget).x,*(float *)((G->IO).KeysDown + 0x164),
                       *(float *)((G->IO).KeysDown + 0x16c));
    }
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      if (((((&Window->DisableInputsFrames)[(long)local_40 * 0x80] & 1U) != 0) &&
          (bVar5 = ImHasFlag<int,ImPlotAxisFlags_>
                             (*(int *)(&Window->WriteAccessed + (long)local_40 * 0x80),
                              ImPlotAxisFlags_NoGridLines), !bVar5)) &&
         (bVar5 = ImHasFlag<int,ImPlotAxisFlags_>
                            (*(int *)(&Window->WriteAccessed + (long)local_40 * 0x80),
                             ImPlotAxisFlags_Foreground), bVar5)) {
        RenderGridLinesY((ImDrawList *)IO,
                         (ImPlotTickCollection *)((G->IO).KeyMap + (long)local_40 * 0xe + 0x1d),
                         (ImRect *)&(Window->DrawListInst).IdxBuffer,
                         (ImU32)(&(Window->DC).CursorStartPos)[(long)local_40 * 0x10].y,
                         *(ImU32 *)((long)&(Window->DC).MenuColumns + (long)local_40 * 0x80 + -0x74)
                         ,*(float *)((G->IO).KeysDown + 0x168),*(float *)((G->IO).KeysDown + 0x170))
        ;
      }
    }
    PopPlotClipRect();
    PushPlotClipRect(0.0);
    bVar5 = ImHasFlag<int,ImPlotAxisFlags_>((int)(Window->Pos).x,ImPlotAxisFlags_NoTickMarks);
    if (!bVar5) {
      for (xt._4_4_ = 0; xt._4_4_ < *(int *)((long)&(G->IO).Fonts + 4); xt._4_4_ = xt._4_4_ + 1) {
        local_50 = ImVector<ImPlotTick>::operator[]
                             ((ImVector<ImPlotTick> *)((G->IO).KeyMap + 0xf),xt._4_4_);
        pIVar4 = IO;
        if (local_50->Level == 0) {
          ImVec2::ImVec2(&local_58,local_50->PixelPos,
                         *(float *)((long)&(Window->DrawListInst).IdxBuffer.Data + 4));
          if ((local_50->Major & 1U) == 0) {
            local_36c = *(float *)((G->IO).KeysDown + 0x14c);
          }
          else {
            local_36c = *(float *)((G->IO).KeysDown + 0x144);
          }
          ImVec2::ImVec2(&local_60,local_50->PixelPos,
                         *(float *)((long)&(Window->DrawListInst).IdxBuffer.Data + 4) - local_36c);
          if ((local_50->Major & 1U) == 0) {
            local_374 = *(float *)((G->IO).KeysDown + 0x15c);
          }
          else {
            local_374 = *(float *)((G->IO).KeysDown + 0x154);
          }
          ImDrawList::AddLine((ImDrawList *)pIVar4,&local_58,&local_60,
                              (ImU32)(Window->ScrollTarget).x,local_374);
        }
      }
    }
    PopPlotClipRect();
    pIVar2 = &Window->DrawListInst;
    ImVec2::ImVec2((ImVec2 *)&i_1,*(float *)&Window->DrawList,
                   *(float *)((long)&(Window->DrawListInst).IdxBuffer.Data + 4));
    ImGui::PushClipRect((ImVec2 *)&pIVar2->IdxBuffer,(ImVec2 *)&i_1,true);
    x_start = 0.0;
    for (direction = 0.0; (int)direction < 3; direction = (float)((int)direction + 1)) {
      if (((&Window->DisableInputsFrames)[(long)(int)direction * 0x80] & 1U) != 0) {
        x_start = (float)((int)x_start + 1);
        fVar14 = *(float *)((G->IO).KeysDown + (long)(int)direction * 4 + 0x14);
        bVar5 = ImHasFlag<int,ImPlotAxisFlags_>
                          (*(int *)(&Window->WriteAccessed + (long)(int)direction * 0x80),
                           ImPlotAxisFlags_NoTickMarks);
        if (!bVar5) {
          local_384 = 1.0;
          if (direction != 0.0) {
            local_384 = -1.0;
          }
          for (yt._0_4_ = 0;
              (int)yt < *(int *)((G->IO).MouseDown + (long)(int)direction * 0x38 + -0x4c);
              yt._0_4_ = (int)yt + 1) {
            start = (ImVec2)ImVector<ImPlotTick>::operator[]
                                      ((ImVector<ImPlotTick> *)
                                       ((G->IO).KeyMap + (long)(int)direction * 0xe + 0x1d),(int)yt)
            ;
            ImVec2::ImVec2(&local_90,fVar14,*(float *)((long)start + 8));
            pIVar4 = IO;
            if ((2 < (int)x_start) || ((*(byte *)((long)start + 0x18) & 1) == 0)) {
              local_39c = *(float *)((G->IO).KeysDown + 0x150);
            }
            else {
              local_39c = *(float *)((G->IO).KeysDown + 0x148);
            }
            ImVec2::ImVec2(&local_a0,local_384 * local_39c,0.0);
            local_98 = ::operator+(&local_90,&local_a0);
            if ((2 < (int)x_start) || ((*(byte *)((long)start + 0x18) & 1) == 0)) {
              local_3ac = *(float *)((G->IO).KeysDown + 0x160);
            }
            else {
              local_3ac = *(float *)((G->IO).KeysDown + 0x158);
            }
            ImDrawList::AddLine((ImDrawList *)pIVar4,&local_90,&local_98,
                                (ImU32)(&(Window->DC).CursorStartPos)[(long)(int)direction * 0x10].y
                                ,local_3ac);
          }
        }
        pIVar4 = IO;
        if (2 < (int)x_start) {
          ImVec2::ImVec2(&local_a8,fVar14,(float)(Window->DrawListInst).IdxBuffer.Capacity);
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff50,fVar14,
                         *(float *)((long)&(Window->DrawListInst).IdxBuffer.Data + 4));
          IVar6 = GetStyleColorU32(0x14);
          ImDrawList::AddLine((ImDrawList *)pIVar4,&local_a8,(ImVec2 *)&stack0xffffffffffffff50,
                              IVar6,1.0);
        }
      }
    }
    ImGui::PopClipRect();
    PushPlotClipRect(0.0);
    for (txt._4_4_ = 0; pIVar4 = IO, txt._4_4_ < *(int *)((G->IO).KeysDown + 0x44);
        txt._4_4_ = txt._4_4_ + 1) {
      pcVar9 = ImPlotAnnotationCollection::GetText
                         ((ImPlotAnnotationCollection *)((G->IO).KeysDown + 0x24),txt._4_4_);
      p1 = ImVector<ImPlotAnnotation>::operator[]
                     ((ImVector<ImPlotAnnotation> *)((G->IO).KeysDown + 0x24),txt._4_4_);
      size = ImGui::CalcTextSize(pcVar9,(char *)0x0,false,-1.0);
      pos = ::operator*((ImVec2 *)((G->IO).KeysDown + 0x1a4),2.0);
      local_d8 = ::operator+(&size,&pos);
      fVar14 = (p1->Offset).x;
      local_e8.x = (p1->Pos).x;
      local_e8.y = (p1->Pos).y;
      if ((fVar14 != 0.0) || (NAN(fVar14))) {
        if ((p1->Offset).x <= 0.0) {
          local_e8.x = local_e8.x - (local_d8.x - (p1->Offset).x);
        }
        else {
          local_e8.x = (p1->Offset).x + local_e8.x;
        }
      }
      else {
        local_e8.x = local_e8.x - local_d8.x / 2.0;
      }
      fVar14 = (p1->Offset).y;
      if ((fVar14 != 0.0) || (NAN(fVar14))) {
        if ((p1->Offset).y <= 0.0) {
          local_e8.y = local_e8.y - (local_d8.y - (p1->Offset).y);
        }
        else {
          local_e8.y = (p1->Offset).y + local_e8.y;
        }
      }
      else {
        local_e8.y = local_e8.y - local_d8.y / 2.0;
      }
      if ((p1->Clamp & 1U) != 0) {
        rect.Max = local_e8;
        local_e8 = ClampLabelPos(local_e8,&local_d8,(ImVec2 *)&(Window->DrawListInst).IdxBuffer,
                                 (ImVec2 *)&(Window->DrawListInst).IdxBuffer.Data);
      }
      local_110 = ::operator+(&local_e8,&local_d8);
      ImRect::ImRect((ImRect *)local_108,&local_e8,&local_110);
      fVar14 = (p1->Offset).x;
      if ((((fVar14 != 0.0) || (NAN(fVar14))) || (fVar14 = (p1->Offset).y, fVar14 != 0.0)) ||
         (NAN(fVar14))) {
        _min_len = ImRect::GetTL((ImRect *)local_108);
        corners[0] = ImRect::GetTR((ImRect *)local_108);
        corners[1] = ImRect::GetBR((ImRect *)local_108);
        corners[2] = ImRect::GetBL((ImRect *)local_108);
        c = 0;
        len = 3.4028235e+38;
        for (local_144 = 0; local_144 < 4; local_144 = local_144 + 1) {
          local_150 = operator-(&p1->Pos,(ImVec2 *)(&min_len + (long)local_144 * 2));
          local_148 = ImLengthSqr(&local_150);
          if (local_148 < len) {
            c = local_144;
            len = local_148;
          }
        }
        ImDrawList::AddLine((ImDrawList *)IO,&p1->Pos,(ImVec2 *)(&min_len + (long)c * 2),p1->ColorBg
                            ,1.0);
      }
      ImDrawList::AddRectFilled((ImDrawList *)IO,(ImVec2 *)local_108,&rect.Min,p1->ColorBg,0.0,0);
      pIVar4 = IO;
      local_158 = ::operator+(&local_e8,(ImVec2 *)((G->IO).KeysDown + 0x1a4));
      ImDrawList::AddText((ImDrawList *)pIVar4,&local_158,p1->ColorFg,pcVar9,(char *)0x0);
    }
    if (((Window->StateStorage).Data.Size & 0x10000) != 0) {
      local_160 = ::operator+(&(Window->ContentRegionRect).Min,
                              (ImVec2 *)&(Window->DrawListInst).IdxBuffer);
      local_168 = ::operator+(&(Window->ContentRegionRect).Max,
                              (ImVec2 *)&(Window->DrawListInst).IdxBuffer);
      IVar17 = GetStyleColorVec4(0x15);
      local_178._0_8_ = IVar17._0_8_;
      local_178._8_8_ = IVar17._8_8_;
      RenderSelectionRect((ImDrawList *)pIVar4,&local_160,&local_168,&local_178);
    }
    pIVar4 = IO;
    if (((Window->StateStorage).Data.Capacity & 0x100) != 0) {
      local_180 = ::operator+((ImVec2 *)&Window->LastFrameActive,
                              (ImVec2 *)&(Window->DrawListInst).IdxBuffer);
      local_188 = ::operator+((ImVec2 *)&Window->ItemWidthDefault,
                              (ImVec2 *)&(Window->DrawListInst).IdxBuffer);
      IVar17 = GetStyleColorVec4(0x16);
      xy = IVar17._0_8_;
      RenderSelectionRect((ImDrawList *)pIVar4,&local_180,&local_188,(ImVec4 *)&xy);
    }
    bVar5 = ImHasFlag<int,ImPlotFlags_>(*(int *)((long)&Window->Name + 4),ImPlotFlags_Crosshairs);
    if (((((bVar5) && (((ulong)(Window->StateStorage).Data.Data & 0x1000000) != 0)) &&
         ((((uint)(Window->ContentSizeIdeal).x & 1) == 0 &&
          (((t._3_1_ & 1) == 0 && (((Window->StateStorage).Data.Size & 0x100) == 0)))))) &&
        (((Window->StateStorage).Data.Capacity & 1) == 0)) &&
       (((Window->StateStorage).Data.Capacity & 0x1000000) == 0)) {
      ImGui::SetMouseCursor(-1);
      IVar1 = _i->MousePos;
      h1.y = IVar1.y;
      ImVec2::ImVec2(&h2,(float)(Window->DrawListInst).IdxBuffer.Size,h1.y);
      h1.x = IVar1.x;
      ImVec2::ImVec2(&h3,h1.x - 5.0,h1.y);
      ImVec2::ImVec2(&h4,h1.x + 5.0,h1.y);
      ImVec2::ImVec2(&v1,*(float *)&(Window->DrawListInst).IdxBuffer.Data,h1.y);
      ImVec2::ImVec2(&v2,h1.x,(float)(Window->DrawListInst).IdxBuffer.Capacity);
      ImVec2::ImVec2(&v3,h1.x,h1.y - 5.0);
      ImVec2::ImVec2(&v4,h1.x,h1.y + 5.0);
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe20,h1.x,
                     *(float *)((long)&(Window->DrawListInst).IdxBuffer.Data + 4));
      IVar6 = GetStyleColorU32(0x17);
      ImDrawList::AddLine((ImDrawList *)IO,&h2,&h3,IVar6,1.0);
      ImDrawList::AddLine((ImDrawList *)IO,&h4,&v1,IVar6,1.0);
      ImDrawList::AddLine((ImDrawList *)IO,&v2,&v3,IVar6,1.0);
      ImDrawList::AddLine((ImDrawList *)IO,&v4,(ImVec2 *)&stack0xfffffffffffffe20,IVar6,1.0);
    }
    bVar5 = ImHasFlag<int,ImPlotFlags_>(*(int *)((long)&Window->Name + 4),ImPlotFlags_NoMousePos);
    if ((!bVar5) && (((ulong)(Window->StateStorage).Data.Data & 0x1000000) != 0)) {
      memset(&writer.Size,0,0x80);
      ImBufferWriter::ImBufferWriter((ImBufferWriter *)&written,(char *)&writer.Size,0x80);
      bVar5 = ImHasFlag<int,ImPlotAxisFlags_>((int)(Window->Pos).x,ImPlotAxisFlags_Time);
      if (bVar5) {
        dVar15 = ImPlotRange::Size((ImPlotRange *)&Window->Size);
        fVar14 = ImRect::GetWidth((ImRect *)&(Window->DrawListInst).IdxBuffer);
        local_27c = GetUnitForRange(dVar15 / (double)(fVar14 / 100.0));
        IVar16 = ImPlotTime::FromDouble(*(double *)((G->IO).KeysDownDuration + 0xb0));
        local_290 = IVar16.S;
        local_288 = IVar16.Us;
        lVar13 = (long)(int)writer.Buffer._4_4_;
        uVar7 = ~writer.Buffer._4_4_ + (int)writer.Buffer;
        IVar18 = GetDateTimeFmt((ImPlotDateTimeFmt *)TimeFormatMouseCursor,local_27c);
        local_2b8 = IVar18._8_2_;
        local_2a4 = CONCAT22(local_2a4._2_2_,local_2b8);
        fmt.Time = 0;
        fmt.Date = local_2a4;
        fmt._8_4_ = (undefined4)in_R9;
        local_280 = FormatDateTime((ImPlot *)&local_290,(ImPlotTime *)(_written + lVar13),
                                   (char *)(ulong)uVar7,IVar18.Date,fmt);
        if (0 < local_280) {
          iVar8 = ImMin<int>(local_280,((int)writer.Buffer - writer.Buffer._4_4_) + -1);
          writer.Buffer._4_4_ = iVar8 + writer.Buffer._4_4_;
        }
      }
      else {
        pcVar9 = GetFormatX();
        RoundAxisValue((ImPlotAxis *)&Window->Pos,(ImPlotTickCollection *)((G->IO).KeyMap + 0xf),
                       *(double *)((G->IO).KeysDownDuration + 0xb0));
        ImBufferWriter::Write((ImBufferWriter *)&written,pcVar9);
      }
      ImBufferWriter::Write((ImBufferWriter *)&written,", ");
      pcVar9 = GetFormatY(0);
      RoundAxisValue((ImPlotAxis *)&Window->WriteAccessed,
                     (ImPlotTickCollection *)&(G->IO).FontGlobalScale,
                     *(double *)((G->IO).KeysDownDuration + 0xb2));
      ImBufferWriter::Write((ImBufferWriter *)&written,pcVar9);
      bVar5 = ImHasFlag<int,ImPlotFlags_>(*(int *)((long)&Window->Name + 4),ImPlotFlags_YAxis2);
      if (bVar5) {
        ImBufferWriter::Write((ImBufferWriter *)&written,", (");
        pcVar9 = GetFormatY(1);
        RoundAxisValue((ImPlotAxis *)&(Window->DC).CurrLineTextBaseOffset,
                       (ImPlotTickCollection *)&(G->IO).BackendPlatformUserData,
                       *(double *)((G->IO).KeysDownDuration + 0xb6));
        ImBufferWriter::Write((ImBufferWriter *)&written,pcVar9);
        ImBufferWriter::Write((ImBufferWriter *)&written,")");
      }
      bVar5 = ImHasFlag<int,ImPlotFlags_>(*(int *)((long)&Window->Name + 4),ImPlotFlags_YAxis3);
      if (bVar5) {
        ImBufferWriter::Write((ImBufferWriter *)&written,", (");
        pcVar9 = GetFormatY(2);
        RoundAxisValue((ImPlotAxis *)&(Window->DC).ChildWindows,
                       (ImPlotTickCollection *)&(G->IO).ImeWindowHandle,
                       *(double *)((G->IO).KeysDownDuration + 0xba));
        ImBufferWriter::Write((ImBufferWriter *)&written,pcVar9);
        ImBufferWriter::Write((ImBufferWriter *)&written,")");
      }
      pos_1 = ImGui::CalcTextSize((char *)&writer.Size,(char *)0x0,false,-1.0);
      register0x00001200 =
           GetLocationPos((ImRect *)&(Window->DrawListInst).IdxBuffer,&pos_1,
                          (Window->ColumnsStorage).Capacity,(ImVec2 *)((G->IO).KeysDown + 0x19c));
      pIVar4 = IO;
      IVar6 = GetStyleColorU32(0xc);
      ImDrawList::AddText((ImDrawList *)pIVar4,(ImVec2 *)&legend_size.y,IVar6,(char *)&writer.Size,
                          (char *)0x0);
    }
    PopPlotClipRect();
    *(undefined1 *)((long)&(Window->StateStorage).Data.Capacity + 3) = 0;
    for (legend_size.x = 0.0; fVar14 = legend_size.x,
        iVar8 = ImPool<ImPlotItem>::GetBufSize((ImPool<ImPlotItem> *)&Window->WorkRect),
        (int)fVar14 < iVar8; legend_size.x = (float)((int)legend_size.x + 1)) {
      pIVar10 = ImPool<ImPlotItem>::GetByIndex
                          ((ImPool<ImPlotItem> *)&Window->WorkRect,(ImPoolIdx)legend_size.x);
      pIVar10->LegendHovered = false;
    }
    bVar5 = ImHasFlag<int,ImPlotFlags_>(*(int *)((long)&Window->Name + 4),ImPlotFlags_NoLegend);
    if ((bVar5) || (iVar8 = ImPlotPlot::GetLegendCount((ImPlotPlot *)Window), iVar8 < 1)) {
      ImRect::ImRect((ImRect *)((long)&ext_size + 4));
      (Window->DrawListInst).Flags = ext_size._4_4_;
      (Window->DrawListInst)._VtxCurrentIdx = uStack_320;
      (Window->DrawListInst)._Data = local_31c;
    }
    else {
      legend_pos = CalcLegendSize((ImPlotPlot *)Window,(ImVec2 *)((G->IO).KeysDown + 0x18c),
                                  (ImVec2 *)((G->IO).KeysDown + 0x194),
                                  *(ImPlotOrientation *)((long)&(Window->ColumnsStorage).Data + 4));
      if (((ulong)(Window->StateStorage).Data.Data & 1) == 0) {
        local_428 = (ImRect *)&(Window->DrawListInst).IdxBuffer;
      }
      else {
        local_428 = (ImRect *)&Window->FontWindowScale;
      }
      if (((ulong)(Window->StateStorage).Data.Data & 1) == 0) {
        local_440 = (ImVec2 *)((G->IO).KeysDown + 0x184);
      }
      else {
        local_440 = (ImVec2 *)((G->IO).KeysDown + 0x174);
      }
      local_2f4 = GetLocationPos(local_428,&legend_pos,
                                 *(ImPlotLocation *)&(Window->ColumnsStorage).Data,local_440);
      _col_bd = ::operator+(&local_2f4,&legend_pos);
      ImRect::ImRect(&local_304,&local_2f4,(ImVec2 *)&col_bd);
      (Window->DrawListInst).Flags = (ImDrawListFlags)local_304.Min.x;
      (Window->DrawListInst)._VtxCurrentIdx = (uint)local_304.Min.y;
      (Window->DrawListInst)._Data = (ImDrawListSharedData *)local_304.Max;
      local_441 = false;
      if (((ulong)(Window->StateStorage).Data.Data & 0x10000) != 0) {
        local_441 = ImRect::Contains((ImRect *)&(Window->DrawListInst).Flags,&_i->MousePos);
      }
      *(bool *)((long)&(Window->StateStorage).Data.Capacity + 3) = local_441;
      if (((ulong)(Window->StateStorage).Data.Data & 1) == 0) {
        PushPlotClipRect(0.0);
      }
      else {
        ImGui::PushClipRect((ImVec2 *)&Window->FontWindowScale,(ImVec2 *)&Window->DrawList,true);
      }
      local_310 = GetStyleColorU32(8);
      local_314 = GetStyleColorU32(9);
      ImDrawList::AddRectFilled
                ((ImDrawList *)IO,(ImVec2 *)&(Window->DrawListInst).Flags,
                 (ImVec2 *)&(Window->DrawListInst)._Data,local_310,0.0,0);
      ImDrawList::AddRect((ImDrawList *)IO,(ImVec2 *)&(Window->DrawListInst).Flags,
                          (ImVec2 *)&(Window->DrawListInst)._Data,local_314,0.0,0,1.0);
      ShowLegendEntries((ImPlotPlot *)Window,(ImRect *)&(Window->DrawListInst).Flags,
                        (bool)(*(byte *)((long)&(Window->StateStorage).Data.Capacity + 3) & 1),
                        (ImVec2 *)((G->IO).KeysDown + 0x18c),(ImVec2 *)((G->IO).KeysDown + 0x194),
                        *(ImPlotOrientation *)((long)&(Window->ColumnsStorage).Data + 4),
                        (ImDrawList *)IO);
      ImGui::PopClipRect();
    }
    pIVar4 = IO;
    if (((ulong)(Window->StateStorage).Data.Data & 0x100) != 0) {
      *(byte *)&(Window->StateStorage).Data.Data =
           (*(byte *)&(Window->StateStorage).Data.Data ^ 0xff) & 1;
      *(undefined1 *)((long)&(Window->StateStorage).Data.Data + 1) = 0;
    }
    if (0.0 < *(float *)((G->IO).KeysDown + 0x13c)) {
      pIVar2 = &Window->DrawListInst;
      pIVar3 = &Window->DrawListInst;
      IVar6 = GetStyleColorU32(7);
      ImDrawList::AddRect((ImDrawList *)pIVar4,(ImVec2 *)&pIVar2->IdxBuffer,
                          (ImVec2 *)&(pIVar3->IdxBuffer).Data,IVar6,0.0,0xf0,
                          *(float *)((G->IO).KeysDown + 0x13c));
    }
    ext_size._3_1_ =
         ImHasFlag<int,ImPlotFlags_>(*(int *)((long)&Window->Name + 4),ImPlotFlags_Equal);
    if ((((G->IO).KeysDown[0x10c] & 1U) != 0) &&
       ((0 < (int)(G->IO).KeysDownDuration[0x48] ||
        (((Window->StateStorage).Data.Capacity & 0x100) != 0)))) {
      if (((G->IO).KeysDown[0x10d] & 1U) != 0) {
        dVar15 = ImPlotRange::Size((ImPlotRange *)((G->IO).KeysDown + 0xcc));
        *(double *)((G->IO).KeysDown + 0xcc) =
             -(dVar15 * 0.5) * (double)*(float *)((G->IO).KeysDown + 0x1ac) +
             *(double *)((G->IO).KeysDown + 0xcc);
        *(double *)((G->IO).KeysDown + 0xd4) =
             dVar15 * 0.5 * (double)*(float *)((G->IO).KeysDown + 0x1ac) +
             *(double *)((G->IO).KeysDown + 0xd4);
        bVar5 = ImPlotAxis::IsLockedMin((ImPlotAxis *)&Window->Pos);
        if ((!bVar5) && (bVar5 = ImNanOrInf(*(double *)((G->IO).KeysDown + 0xcc)), !bVar5)) {
          Window->Size = *(ImVec2 *)((G->IO).KeysDown + 0xcc);
        }
        bVar5 = ImPlotAxis::IsLockedMax((ImPlotAxis *)&Window->Pos);
        if ((!bVar5) && (bVar5 = ImNanOrInf(*(double *)((G->IO).KeysDown + 0xd4)), !bVar5)) {
          Window->SizeFull = *(ImVec2 *)((G->IO).KeysDown + 0xd4);
        }
        bVar5 = ImAlmostEqual((double)Window->SizeFull,(double)Window->Size,2);
        if (bVar5) {
          Window->SizeFull = (ImVec2)((double)Window->SizeFull + 0.5);
          Window->Size = (ImVec2)((double)Window->Size - 0.5);
        }
        ImPlotAxis::Constrain((ImPlotAxis *)&Window->Pos);
        if (((ext_size._3_1_ & 1) != 0) && (((G->IO).KeysDown[0x10e] & 1U) == 0)) {
          pbVar11 = &Window->WriteAccessed;
          dVar15 = ImPlotAxis::GetAspect((ImPlotAxis *)&Window->Pos);
          ImPlotAxis::SetAspect((ImPlotAxis *)pbVar11,dVar15);
        }
      }
      for (ext_size_1._4_4_ = 0; ext_size_1._4_4_ < 3; ext_size_1._4_4_ = ext_size_1._4_4_ + 1) {
        if (((G->IO).KeysDown[(long)ext_size_1._4_4_ + 0x10e] & 1U) != 0) {
          dVar15 = ImPlotRange::Size((ImPlotRange *)
                                     ((G->IO).KeysDown + (long)ext_size_1._4_4_ * 0x10 + 0xdc));
          pbVar11 = (G->IO).KeysDown + (long)ext_size_1._4_4_ * 0x10 + 0xdc;
          *(double *)pbVar11 =
               -(dVar15 * 0.5) * (double)*(float *)((G->IO).KeysDown + 0x1b0) + *(double *)pbVar11;
          *(double *)((G->IO).KeysDown + (long)ext_size_1._4_4_ * 0x10 + 0xe4) =
               dVar15 * 0.5 * (double)*(float *)((G->IO).KeysDown + 0x1b0) +
               *(double *)((G->IO).KeysDown + (long)ext_size_1._4_4_ * 0x10 + 0xe4);
          bVar5 = ImPlotAxis::IsLockedMin
                            ((ImPlotAxis *)(&Window->WriteAccessed + (long)ext_size_1._4_4_ * 0x80))
          ;
          if ((!bVar5) &&
             (bVar5 = ImNanOrInf(*(double *)
                                  ((G->IO).KeysDown + (long)ext_size_1._4_4_ * 0x10 + 0xdc)), !bVar5
             )) {
            *(undefined8 *)(&Window->ResizeBorderHeld + (long)ext_size_1._4_4_ * 0x80) =
                 *(undefined8 *)((G->IO).KeysDown + (long)ext_size_1._4_4_ * 0x10 + 0xdc);
          }
          bVar5 = ImPlotAxis::IsLockedMax
                            ((ImPlotAxis *)(&Window->WriteAccessed + (long)ext_size_1._4_4_ * 0x80))
          ;
          if ((!bVar5) &&
             (bVar5 = ImNanOrInf(*(double *)
                                  ((G->IO).KeysDown + (long)ext_size_1._4_4_ * 0x10 + 0xe4)), !bVar5
             )) {
            *(undefined8 *)(&Window->FocusOrder + (long)ext_size_1._4_4_ * 0x40) =
                 *(undefined8 *)((G->IO).KeysDown + (long)ext_size_1._4_4_ * 0x10 + 0xe4);
          }
          bVar5 = ImAlmostEqual(*(double *)(&Window->FocusOrder + (long)ext_size_1._4_4_ * 0x40),
                                *(double *)
                                 (&Window->ResizeBorderHeld + (long)ext_size_1._4_4_ * 0x80),2);
          if (bVar5) {
            *(double *)(&Window->FocusOrder + (long)ext_size_1._4_4_ * 0x40) =
                 *(double *)(&Window->FocusOrder + (long)ext_size_1._4_4_ * 0x40) + 0.5;
            *(double *)(&Window->ResizeBorderHeld + (long)ext_size_1._4_4_ * 0x80) =
                 *(double *)(&Window->ResizeBorderHeld + (long)ext_size_1._4_4_ * 0x80) - 0.5;
          }
          ImPlotAxis::Constrain
                    ((ImPlotAxis *)(&Window->WriteAccessed + (long)ext_size_1._4_4_ * 0x80));
          if (((ext_size_1._4_4_ == 0) && ((ext_size._3_1_ & 1) != 0)) &&
             (((G->IO).KeysDown[0x10d] & 1U) == 0)) {
            pIVar12 = &Window->Pos;
            dVar15 = ImPlotAxis::GetAspect((ImPlotAxis *)&Window->WriteAccessed);
            ImPlotAxis::SetAspect((ImPlotAxis *)pIVar12,dVar15);
          }
        }
      }
      if ((((ext_size._3_1_ & 1) != 0) && (((G->IO).KeysDown[0x10d] & 1U) != 0)) &&
         (((G->IO).KeysDown[0x10e] & 1U) != 0)) {
        dVar15 = ImPlotAxis::GetAspect((ImPlotAxis *)&Window->Pos);
        rhs = ImPlotAxis::GetAspect((ImPlotAxis *)&Window->WriteAccessed);
        dVar15 = ImMax<double>(dVar15,rhs);
        ImPlotAxis::SetAspect((ImPlotAxis *)&Window->Pos,dVar15);
        ImPlotAxis::SetAspect((ImPlotAxis *)&Window->WriteAccessed,dVar15);
      }
    }
    bVar5 = ImHasFlag<int,ImPlotFlags_>(*(int *)((long)&Window->Name + 4),ImPlotFlags_NoMenus);
    if (((!bVar5) && (((ulong)(Window->StateStorage).Data.Data & 0x1000000) != 0)) &&
       (((_i->MouseReleased[(int)(G->IO).KeysDownDuration[0xa7]] & 1U) != 0 &&
        ((((Window->StateStorage).Data.Capacity & 0x1000000) == 0 &&
         (((Window->StateStorage).Data.Size & 0x1000000) == 0)))))) {
      ImGui::OpenPopup("##PlotContext",0);
    }
    bVar5 = ImGui::BeginPopup("##PlotContext",0);
    if (bVar5) {
      ShowPlotContextMenu((ImPlotPlot *)Window);
      ImGui::EndPopup();
    }
    bVar5 = ImHasFlag<int,ImPlotFlags_>(*(int *)((long)&Window->Name + 4),ImPlotFlags_NoMenus);
    if (((((!bVar5) && (((ulong)(Window->StateStorage).Data.Data & 0x10000) != 0)) &&
         (((uint)(Window->ContentSizeIdeal).x & 0x100) != 0)) &&
        (((_i->MouseReleased[(int)(G->IO).KeysDownDuration[0xa7]] & 1U) != 0 &&
         (((Window->StateStorage).Data.Capacity & 0x1000000) == 0)))) &&
       (((Window->StateStorage).Data.Size & 0x1000000) == 0)) {
      ImGui::OpenPopup("##XContext",0);
    }
    bVar5 = ImGui::BeginPopup("##XContext",0);
    if (bVar5) {
      ImGui::Text("X-Axis");
      ImGui::Separator();
      pIVar12 = &Window->Pos;
      bVar5 = ImHasFlag<int,ImPlotFlags_>(*(int *)((long)&Window->Name + 4),ImPlotFlags_Equal);
      if (bVar5) {
        local_490 = (ImPlotAxis *)&Window->WriteAccessed;
      }
      else {
        local_490 = (ImPlotAxis *)0x0;
      }
      ShowAxisContextMenu((ImPlotAxis *)pIVar12,local_490,true);
      ImGui::EndPopup();
    }
    for (i_7 = 0; i_7 < 3; i_7 = i_7 + 1) {
      ImGui::PushID(i_7);
      bVar5 = ImHasFlag<int,ImPlotFlags_>(*(int *)((long)&Window->Name + 4),ImPlotFlags_NoMenus);
      if (((((!bVar5) && (((ulong)(Window->StateStorage).Data.Data & 0x10000) != 0)) &&
           (((&Window->HiddenFramesCannotSkipItems)[(long)i_7 * 0x80] & 1U) != 0)) &&
          (((_i->MouseReleased[(int)(G->IO).KeysDownDuration[0xa7]] & 1U) != 0 &&
           (((Window->StateStorage).Data.Capacity & 0x1000000) == 0)))) &&
         (((Window->StateStorage).Data.Size & 0x1000000) == 0)) {
        ImGui::OpenPopup("##YContext",0);
      }
      bVar5 = ImGui::BeginPopup("##YContext",0);
      if (bVar5) {
        if (i_7 == 0) {
          ImGui::Text("Y-Axis");
          ImGui::Separator();
        }
        else {
          ImGui::Text("Y-Axis %d",(ulong)(i_7 + 1));
          ImGui::Separator();
        }
        pbVar11 = &Window->WriteAccessed;
        if ((i_7 == 0) &&
           (bVar5 = ImHasFlag<int,ImPlotFlags_>(*(int *)((long)&Window->Name + 4),ImPlotFlags_Equal)
           , bVar5)) {
          local_4a0 = (ImPlotAxis *)&Window->Pos;
        }
        else {
          local_4a0 = (ImPlotAxis *)0x0;
        }
        ShowAxisContextMenu((ImPlotAxis *)(pbVar11 + (long)i_7 * 0x80),local_4a0,false);
        ImGui::EndPopup();
      }
      ImGui::PopID();
    }
    PushLinkedAxis((ImPlotAxis *)&Window->Pos);
    for (local_350 = 0; local_350 < 3; local_350 = local_350 + 1) {
      PushLinkedAxis((ImPlotAxis *)(&Window->WriteAccessed + (long)local_350 * 0x80));
    }
    if ((((Window->StateStorage).Data.Size & 0x1000000) != 0) &&
       ((_i->MouseReleased[(int)(G->IO).KeysDownDuration[0xa8]] & 1U) != 0)) {
      *(undefined1 *)((long)&(Window->StateStorage).Data.Size + 3) = 0;
    }
    for (local_354 = 0;
        iVar8 = ImPool<ImPlotItem>::GetBufSize((ImPool<ImPlotItem> *)&Window->WorkRect),
        local_354 < iVar8; local_354 = local_354 + 1) {
      pIVar10 = ImPool<ImPlotItem>::GetByIndex((ImPool<ImPlotItem> *)&Window->WorkRect,local_354);
      pIVar10->SeenThisFrame = false;
    }
    *(undefined1 *)&(Window->StateStorage).Data.Size = 1;
    ImGui::PopID();
    Reset(GImPlot);
    return;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"Mismatched BeginPlot()/EndPlot()!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0x8b8,"void ImPlot::EndPlot()");
}

Assistant:

void EndPlot() {
    IM_ASSERT_USER_ERROR(GImPlot != NULL, "No current context. Did you call ImPlot::CreateContext() or ImPlot::SetCurrentContext()?");
    ImPlotContext& gp     = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "Mismatched BeginPlot()/EndPlot()!");
    ImGuiContext &G       = *GImGui;
    ImPlotPlot &plot     = *gp.CurrentPlot;
    ImGuiWindow * Window  = G.CurrentWindow;
    ImDrawList & DrawList = *Window->DrawList;
    const ImGuiIO &   IO  = ImGui::GetIO();

    // AXIS STATES ------------------------------------------------------------

    const bool any_y_dragging = plot.YAxis[0].Dragging || plot.YAxis[1].Dragging || plot.YAxis[2].Dragging;

    // FINAL RENDER -----------------------------------------------------------

    // render grid (foreground)
    PushPlotClipRect(gp.Style.PlotBorderSize == 0 ? 1.0f : 0.0f);
    if (!ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_NoGridLines) && ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_Foreground))
        RenderGridLinesX(DrawList, gp.XTicks, plot.PlotRect, plot.XAxis.ColorMaj, plot.XAxis.ColorMaj, gp.Style.MajorGridSize.x, gp.Style.MinorGridSize.x);
    for (int i = 0; i < IMPLOT_Y_AXES; i++) {
        if (plot.YAxis[i].Present && !ImHasFlag(plot.YAxis[i].Flags, ImPlotAxisFlags_NoGridLines) && ImHasFlag(plot.YAxis[i].Flags, ImPlotAxisFlags_Foreground))
            RenderGridLinesY(DrawList, gp.YTicks[i], plot.PlotRect,  plot.YAxis[i].ColorMaj,  plot.YAxis[i].ColorMin, gp.Style.MajorGridSize.y, gp.Style.MinorGridSize.y);
    }
    PopPlotClipRect();

    // render x-ticks
    PushPlotClipRect();
    if (!ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_NoTickMarks)) {
        for (int t = 0; t < gp.XTicks.Size; t++) {
            ImPlotTick *xt = &gp.XTicks.Ticks[t];
            if (xt->Level == 0)
                DrawList.AddLine(ImVec2(xt->PixelPos, plot.PlotRect.Max.y),
                                ImVec2(xt->PixelPos, plot.PlotRect.Max.y - (xt->Major ? gp.Style.MajorTickLen.x : gp.Style.MinorTickLen.x)),
                                plot.XAxis.ColorMaj,
                                xt->Major ? gp.Style.MajorTickSize.x : gp.Style.MinorTickSize.x);
        }
    }
    PopPlotClipRect();

    // render y-ticks
    ImGui::PushClipRect(plot.PlotRect.Min, ImVec2(plot.FrameRect.Max.x, plot.PlotRect.Max.y), true);
    int axis_count = 0;
    for (int i = 0; i < IMPLOT_Y_AXES; i++) {
        if (!plot.YAxis[i].Present) { continue; }
        axis_count++;
        float x_start = gp.YAxisReference[i];
        if (!ImHasFlag(plot.YAxis[i].Flags, ImPlotAxisFlags_NoTickMarks)) {
            float direction = (i == 0) ? 1.0f : -1.0f;
            bool no_major = axis_count >= 3;
            for (int t = 0; t < gp.YTicks[i].Size; t++) {
                ImPlotTick *yt = &gp.YTicks[i].Ticks[t];
                ImVec2 start = ImVec2(x_start, yt->PixelPos);
                DrawList.AddLine(start,
                                 start + ImVec2(direction * ((!no_major && yt->Major) ? gp.Style.MajorTickLen.y : gp.Style.MinorTickLen.y), 0),
                                 plot.YAxis[i].ColorMaj,
                                 (!no_major && yt->Major) ? gp.Style.MajorTickSize.y : gp.Style.MinorTickSize.y);
            }
        }
        if (axis_count >= 3) {
            // Draw a bar next to the ticks to act as a visual separator.
            DrawList.AddLine(ImVec2(x_start, plot.PlotRect.Min.y), ImVec2(x_start, plot.PlotRect.Max.y), GetStyleColorU32(ImPlotCol_YAxisGrid3), 1);
        }
    }
    ImGui::PopClipRect();

    // render annotations
    PushPlotClipRect();
    for (int i = 0; i < gp.Annotations.Size; ++i) {
        const char* txt       = gp.Annotations.GetText(i);
        ImPlotAnnotation& an  = gp.Annotations.Annotations[i];
        const ImVec2 txt_size = ImGui::CalcTextSize(txt);
        const ImVec2 size     = txt_size + gp.Style.AnnotationPadding * 2;
        ImVec2 pos            = an.Pos;
        if (an.Offset.x == 0)
            pos.x -= size.x / 2;
        else if (an.Offset.x > 0)
            pos.x += an.Offset.x;
        else
            pos.x -= size.x - an.Offset.x;
        if (an.Offset.y == 0)
            pos.y -= size.y / 2;
        else if (an.Offset.y > 0)
            pos.y += an.Offset.y;
        else
            pos.y -= size.y - an.Offset.y;
        if (an.Clamp)
            pos = ClampLabelPos(pos, size, plot.PlotRect.Min, plot.PlotRect.Max);
        ImRect rect(pos,pos+size);
        if (an.Offset.x != 0 || an.Offset.y != 0) {
            ImVec2 corners[4] = {rect.GetTL(), rect.GetTR(), rect.GetBR(), rect.GetBL()};
            int min_corner = 0;
            float min_len = FLT_MAX;
            for (int c = 0; c < 4; ++c) {
                float len = ImLengthSqr(an.Pos - corners[c]);
                if (len < min_len) {
                    min_corner = c;
                    min_len = len;
                }
            }
            DrawList.AddLine(an.Pos, corners[min_corner], an.ColorBg);
        }
        DrawList.AddRectFilled(rect.Min, rect.Max, an.ColorBg);
        DrawList.AddText(pos + gp.Style.AnnotationPadding, an.ColorFg, txt);
    }

    // render selection
    if (plot.Selected)
        RenderSelectionRect(DrawList, plot.SelectRect.Min + plot.PlotRect.Min, plot.SelectRect.Max + plot.PlotRect.Min, GetStyleColorVec4(ImPlotCol_Selection));
    // render query
    if (plot.Queried)
        RenderSelectionRect(DrawList, plot.QueryRect.Min + plot.PlotRect.Min, plot.QueryRect.Max + plot.PlotRect.Min, GetStyleColorVec4(ImPlotCol_Query));

    // render crosshairs
    if (ImHasFlag(plot.Flags, ImPlotFlags_Crosshairs) && plot.PlotHovered && !(plot.XAxis.Dragging || any_y_dragging) && !plot.Selecting && !plot.Querying && !plot.LegendHovered) {
        ImGui::SetMouseCursor(ImGuiMouseCursor_None);
        ImVec2 xy = IO.MousePos;
        ImVec2 h1(plot.PlotRect.Min.x, xy.y);
        ImVec2 h2(xy.x - 5, xy.y);
        ImVec2 h3(xy.x + 5, xy.y);
        ImVec2 h4(plot.PlotRect.Max.x, xy.y);
        ImVec2 v1(xy.x, plot.PlotRect.Min.y);
        ImVec2 v2(xy.x, xy.y - 5);
        ImVec2 v3(xy.x, xy.y + 5);
        ImVec2 v4(xy.x, plot.PlotRect.Max.y);
        ImU32 col = GetStyleColorU32(ImPlotCol_Crosshairs);
        DrawList.AddLine(h1, h2, col);
        DrawList.AddLine(h3, h4, col);
        DrawList.AddLine(v1, v2, col);
        DrawList.AddLine(v3, v4, col);
    }

    // render mouse pos
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMousePos) && plot.PlotHovered) {
        char buffer[128] = {};
        ImBufferWriter writer(buffer, sizeof(buffer));
        // x
        if (ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_Time)) {
            ImPlotTimeUnit unit = GetUnitForRange(plot.XAxis.Range.Size() / (plot.PlotRect.GetWidth() / 100));
            const int written = FormatDateTime(ImPlotTime::FromDouble(gp.MousePos[0].x), &writer.Buffer[writer.Pos], writer.Size - writer.Pos - 1, GetDateTimeFmt(TimeFormatMouseCursor, unit));
            if (written > 0)
                writer.Pos += ImMin(written, writer.Size - writer.Pos - 1);
        }
        else {
            writer.Write(GetFormatX(), RoundAxisValue(plot.XAxis, gp.XTicks, gp.MousePos[0].x));
        }
        // y1
        writer.Write(", ");
        writer.Write(GetFormatY(0), RoundAxisValue(plot.YAxis[0], gp.YTicks[0], gp.MousePos[0].y));
        // y2
        if (ImHasFlag(plot.Flags, ImPlotFlags_YAxis2)) {
            writer.Write(", (");
            writer.Write(GetFormatY(1), RoundAxisValue(plot.YAxis[1], gp.YTicks[1], gp.MousePos[1].y));
            writer.Write(")");
        }
        // y3
        if (ImHasFlag(plot.Flags, ImPlotFlags_YAxis3)) {
            writer.Write(", (");
            writer.Write(GetFormatY(2), RoundAxisValue(plot.YAxis[2], gp.YTicks[2], gp.MousePos[2].y));
            writer.Write(")");
        }
        const ImVec2 size = ImGui::CalcTextSize(buffer);
        const ImVec2 pos = GetLocationPos(plot.PlotRect, size, plot.MousePosLocation, gp.Style.MousePosPadding);
        DrawList.AddText(pos, GetStyleColorU32(ImPlotCol_InlayText), buffer);
    }
    PopPlotClipRect();

    // reset legend hovers
    plot.LegendHovered = false;
    for (int i = 0; i < plot.Items.GetBufSize(); ++i)
        plot.Items.GetByIndex(i)->LegendHovered = false;
    // render legend
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoLegend) && plot.GetLegendCount() > 0) {
        const ImVec2 legend_size = CalcLegendSize(plot, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, plot.LegendOrientation);
        const ImVec2 legend_pos  = GetLocationPos(plot.LegendOutside ? plot.FrameRect : plot.PlotRect,
                                                  legend_size,
                                                  plot.LegendLocation,
                                                  plot.LegendOutside ? gp.Style.PlotPadding : gp.Style.LegendPadding);
        plot.LegendRect = ImRect(legend_pos, legend_pos + legend_size);
        // test hover
        plot.LegendHovered = plot.FrameHovered && plot.LegendRect.Contains(IO.MousePos);

        if (plot.LegendOutside)
            ImGui::PushClipRect(plot.FrameRect.Min, plot.FrameRect.Max, true);
        else
            PushPlotClipRect();
        ImU32  col_bg      = GetStyleColorU32(ImPlotCol_LegendBg);
        ImU32  col_bd      = GetStyleColorU32(ImPlotCol_LegendBorder);
        DrawList.AddRectFilled(plot.LegendRect.Min, plot.LegendRect.Max, col_bg);
        DrawList.AddRect(plot.LegendRect.Min, plot.LegendRect.Max, col_bd);
        ShowLegendEntries(plot, plot.LegendRect, plot.LegendHovered, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, plot.LegendOrientation, DrawList);
        ImGui::PopClipRect();
    }
    else {
        plot.LegendRect = ImRect();
    }
    if (plot.LegendFlipSideNextFrame)  {
        plot.LegendOutside  = !plot.LegendOutside;
        plot.LegendFlipSideNextFrame = false;
    }

    // render border
    if (gp.Style.PlotBorderSize > 0)
        DrawList.AddRect(plot.PlotRect.Min, plot.PlotRect.Max, GetStyleColorU32(ImPlotCol_PlotBorder), 0, ImDrawFlags_RoundCornersAll, gp.Style.PlotBorderSize);

    // FIT DATA --------------------------------------------------------------
    const bool axis_equal = ImHasFlag(plot.Flags, ImPlotFlags_Equal);
    if (gp.FitThisFrame && (gp.VisibleItemCount > 0 || plot.Queried)) {
        if (gp.FitX) {
            const double ext_size = gp.ExtentsX.Size() * 0.5;
            gp.ExtentsX.Min -= ext_size * gp.Style.FitPadding.x;
            gp.ExtentsX.Max += ext_size * gp.Style.FitPadding.x;
            if (!plot.XAxis.IsLockedMin() && !ImNanOrInf(gp.ExtentsX.Min))
                plot.XAxis.Range.Min = (gp.ExtentsX.Min);
            if (!plot.XAxis.IsLockedMax() && !ImNanOrInf(gp.ExtentsX.Max))
                plot.XAxis.Range.Max = (gp.ExtentsX.Max);
            if (ImAlmostEqual(plot.XAxis.Range.Max, plot.XAxis.Range.Min))  {
                plot.XAxis.Range.Max += 0.5;
                plot.XAxis.Range.Min -= 0.5;
            }
            plot.XAxis.Constrain();
            if (axis_equal && !gp.FitY[0])
                plot.YAxis[0].SetAspect(plot.XAxis.GetAspect());
        }
        for (int i = 0; i < IMPLOT_Y_AXES; i++) {
            if (gp.FitY[i]) {
                const double ext_size = gp.ExtentsY[i].Size() * 0.5;
                gp.ExtentsY[i].Min -= ext_size * gp.Style.FitPadding.y;
                gp.ExtentsY[i].Max += ext_size * gp.Style.FitPadding.y;
                if (!plot.YAxis[i].IsLockedMin() && !ImNanOrInf(gp.ExtentsY[i].Min))
                    plot.YAxis[i].Range.Min = (gp.ExtentsY[i].Min);
                if (!plot.YAxis[i].IsLockedMax() && !ImNanOrInf(gp.ExtentsY[i].Max))
                    plot.YAxis[i].Range.Max = (gp.ExtentsY[i].Max);
                if (ImAlmostEqual(plot.YAxis[i].Range.Max, plot.YAxis[i].Range.Min)) {
                    plot.YAxis[i].Range.Max += 0.5;
                    plot.YAxis[i].Range.Min -= 0.5;
                }
                plot.YAxis[i].Constrain();
                if (i == 0 && axis_equal && !gp.FitX)
                    plot.XAxis.SetAspect(plot.YAxis[0].GetAspect());
            }
        }
        if (axis_equal && gp.FitX && gp.FitY[0]) {
            double aspect = ImMax(plot.XAxis.GetAspect(), plot.YAxis[0].GetAspect());
            plot.XAxis.SetAspect(aspect);
            plot.YAxis[0].SetAspect(aspect);
        }
    }

    // CONTEXT MENUS -----------------------------------------------------------

    // main ctx menu
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMenus) && plot.PlotHovered && IO.MouseReleased[gp.InputMap.ContextMenuButton] && !plot.LegendHovered && !plot.ContextLocked)
        ImGui::OpenPopup("##PlotContext");
    if (ImGui::BeginPopup("##PlotContext")) {
        ShowPlotContextMenu(plot);
        ImGui::EndPopup();
    }

    // x-axis ctx menu
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMenus) && plot.FrameHovered && plot.XAxis.ExtHovered && IO.MouseReleased[gp.InputMap.ContextMenuButton] && !plot.LegendHovered && !plot.ContextLocked)
        ImGui::OpenPopup("##XContext");
    if (ImGui::BeginPopup("##XContext")) {
        ImGui::Text("X-Axis"); ImGui::Separator();
        ShowAxisContextMenu(plot.XAxis, ImHasFlag(plot.Flags, ImPlotFlags_Equal) ? &plot.YAxis[0] : NULL, true);
        ImGui::EndPopup();
    }

    // y-axes ctx menus
    for (int i = 0; i < IMPLOT_Y_AXES; ++i) {
        ImGui::PushID(i);
        if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMenus) && plot.FrameHovered && plot.YAxis[i].ExtHovered && IO.MouseReleased[gp.InputMap.ContextMenuButton] && !plot.LegendHovered && !plot.ContextLocked)
            ImGui::OpenPopup("##YContext");
        if (ImGui::BeginPopup("##YContext")) {
            if (i == 0) {
                ImGui::Text("Y-Axis"); ImGui::Separator();
            }
            else {
                ImGui::Text("Y-Axis %d", i + 1); ImGui::Separator();
            }
            ShowAxisContextMenu(plot.YAxis[i], (i == 0 && ImHasFlag(plot.Flags, ImPlotFlags_Equal)) ? &plot.XAxis : NULL, false);
            ImGui::EndPopup();
        }
        ImGui::PopID();
    }


    // LINKED AXES ------------------------------------------------------------

    PushLinkedAxis(plot.XAxis);
    for (int i = 0; i < IMPLOT_Y_AXES; ++i)
        PushLinkedAxis(plot.YAxis[i]);

    // CLEANUP ----------------------------------------------------------------

    // resset context locked flag
    if (plot.ContextLocked && IO.MouseReleased[gp.InputMap.BoxSelectButton])
        plot.ContextLocked = false;


    // reset the plot items for the next frame
    for (int i = 0; i < plot.Items.GetBufSize(); ++i) {
        plot.Items.GetByIndex(i)->SeenThisFrame = false;
    }

    // mark the plot as initialized, i.e. having made it through one frame completely
    plot.Initialized = true;

    // Pop ImGui::PushID at the end of BeginPlot
    ImGui::PopID();
    // Reset context for next plot
    Reset(GImPlot);
}